

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_4,_4> *
deqp::gles3::Functional::MatrixCaseUtils::inverse<4>
          (Matrix<float,_4,_4> *__return_storage_ptr__,Matrix<float,_4,_4> *mat)

{
  float *pfVar1;
  float local_218;
  float local_214;
  float result [16];
  Matrix<float,_2,_2> blockD;
  Matrix<float,_2,_2> local_1b4;
  undefined1 local_1a4 [8];
  Matrix<float,_2,_2> blockC;
  Matrix<float,_2,_2> local_184;
  undefined1 local_174 [8];
  Matrix<float,_2,_2> blockB;
  Matrix<float,_2,_2> local_154;
  Matrix<float,_2,_2> local_144;
  Matrix<float,_2,_2> local_134;
  undefined1 local_124 [8];
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_2> zeroMat;
  Matrix<float,_2,_2> local_f4;
  Matrix<float,_2,_2> local_e4;
  undefined1 local_d4 [8];
  Matrix<float,_2,_2> schurComplement;
  Matrix<float,_2,_2> matD;
  Matrix<float,_2,_2> matC;
  Matrix<float,_2,_2> matB;
  Matrix<float,_2,_2> local_88;
  undefined1 local_78 [8];
  Matrix<float,_2,_2> invA;
  float nullField [4];
  float areaD [4];
  float areaC [4];
  float areaB [4];
  float areaA [4];
  Matrix<float,_4,_4> *mat_local;
  
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,0,0);
  areaB[2] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,0,1);
  areaB[3] = *pfVar1;
  tcu::Matrix<float,_4,_4>::operator()(mat,1,0);
  tcu::Matrix<float,_4,_4>::operator()(mat,1,1);
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,0,2);
  areaC[2] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,0,3);
  areaC[3] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,1,2);
  areaB[0] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,1,3);
  areaB[1] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,2,0);
  areaD[2] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,2,1);
  areaD[3] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,3,0);
  areaC[0] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,3,1);
  areaC[1] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,2,2);
  nullField[2] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,2,3);
  nullField[3] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,3,2);
  areaD[0] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_4,_4>::operator()(mat,3,3);
  areaD[1] = *pfVar1;
  invA.m_data.m_data[1].m_data[0] = 0.0;
  invA.m_data.m_data[1].m_data[1] = 0.0;
  nullField[0] = 0.0;
  nullField[1] = 0.0;
  tcu::Matrix<float,_2,_2>::Matrix(&local_88,areaB + 2);
  inverse<2>((MatrixCaseUtils *)local_78,&local_88);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_88);
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)(matC.m_data.m_data + 1),areaC + 2);
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)(matD.m_data.m_data + 1),areaD + 2);
  tcu::Matrix<float,_2,_2>::Matrix
            ((Matrix<float,_2,_2> *)(schurComplement.m_data.m_data + 1),nullField + 2);
  tcu::operator*((tcu *)(zeroMat.m_data.m_data + 1),(Matrix<float,_2,_2> *)(matD.m_data.m_data + 1),
                 (Matrix<float,_2,_2> *)local_78);
  tcu::operator*((tcu *)&local_f4,(Matrix<float,_2,_2> *)(zeroMat.m_data.m_data + 1),
                 (Matrix<float,_2,_2> *)(matC.m_data.m_data + 1));
  tcu::operator-((tcu *)&local_e4,(Matrix<float,_2,_2> *)(schurComplement.m_data.m_data + 1),
                 &local_f4);
  inverse<2>((MatrixCaseUtils *)local_d4,&local_e4);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_e4);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_f4);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(zeroMat.m_data.m_data + 1));
  tcu::Matrix<float,_2,_2>::Matrix
            ((Matrix<float,_2,_2> *)(blockA.m_data.m_data + 1),invA.m_data.m_data[1].m_data);
  tcu::operator*((tcu *)(blockB.m_data.m_data + 1),(Matrix<float,_2,_2> *)local_78,
                 (Matrix<float,_2,_2> *)(matC.m_data.m_data + 1));
  tcu::operator*((tcu *)&local_154,(Matrix<float,_2,_2> *)(blockB.m_data.m_data + 1),
                 (Matrix<float,_2,_2> *)local_d4);
  tcu::operator*((tcu *)&local_144,&local_154,(Matrix<float,_2,_2> *)(matD.m_data.m_data + 1));
  tcu::operator*((tcu *)&local_134,&local_144,(Matrix<float,_2,_2> *)local_78);
  tcu::operator+((tcu *)local_124,(Matrix<float,_2,_2> *)local_78,&local_134);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_134);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_144);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_154);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(blockB.m_data.m_data + 1));
  tcu::operator-((tcu *)(blockC.m_data.m_data + 1),(Matrix<float,_2,_2> *)(blockA.m_data.m_data + 1)
                 ,(Matrix<float,_2,_2> *)local_78);
  tcu::operator*((tcu *)&local_184,(Matrix<float,_2,_2> *)(blockC.m_data.m_data + 1),
                 (Matrix<float,_2,_2> *)(matC.m_data.m_data + 1));
  tcu::operator*((tcu *)local_174,&local_184,(Matrix<float,_2,_2> *)local_d4);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_184);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(blockC.m_data.m_data + 1));
  tcu::operator-((tcu *)(blockD.m_data.m_data + 1),(Matrix<float,_2,_2> *)(blockA.m_data.m_data + 1)
                 ,(Matrix<float,_2,_2> *)local_d4);
  tcu::operator*((tcu *)&local_1b4,(Matrix<float,_2,_2> *)(blockD.m_data.m_data + 1),
                 (Matrix<float,_2,_2> *)(matD.m_data.m_data + 1));
  tcu::operator*((tcu *)local_1a4,&local_1b4,(Matrix<float,_2,_2> *)local_78);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_1b4);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(blockD.m_data.m_data + 1));
  tcu::Matrix<float,_2,_2>::Matrix
            ((Matrix<float,_2,_2> *)(result + 0xf),(Matrix<float,_2,_2> *)local_d4);
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_124,0,0);
  local_218 = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_124,0,1);
  local_214 = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_174,0,0);
  result[0] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_174,0,1);
  result[1] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_124,1,0);
  result[2] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_124,1,1);
  result[3] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_174,1,0);
  result[4] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_174,1,1);
  result[5] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_1a4,0,0);
  result[6] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_1a4,0,1);
  result[7] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)(result + 0xf),0,0);
  result[8] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)(result + 0xf),0,1);
  result[9] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_1a4,1,0);
  result[10] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)local_1a4,1,1);
  result[0xb] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)(result + 0xf),1,0);
  result[0xc] = *pfVar1;
  pfVar1 = tcu::Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)(result + 0xf),1,1);
  result[0xd] = *pfVar1;
  tcu::Matrix<float,_4,_4>::Matrix(__return_storage_ptr__,&local_218);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(result + 0xf));
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_1a4);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_174);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_124);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(blockA.m_data.m_data + 1));
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_d4);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(schurComplement.m_data.m_data + 1));
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(matD.m_data.m_data + 1));
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)(matC.m_data.m_data + 1));
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<float, 4, 4> inverse<4> (const tcu::Matrix<float, 4, 4>& mat)
{
	// Blockwise inversion

	DE_ASSERT(determinant(mat) != 0.0f);

	const float areaA[2*2] =
	{
		mat(0,0),	mat(0,1),
		mat(1,0),	mat(1,1)
	};
	const float areaB[2*2] =
	{
		mat(0,2),	mat(0,3),
		mat(1,2),	mat(1,3)
	};
	const float areaC[2*2] =
	{
		mat(2,0),	mat(2,1),
		mat(3,0),	mat(3,1)
	};
	const float areaD[2*2] =
	{
		mat(2,2),	mat(2,3),
		mat(3,2),	mat(3,3)
	};
	const float nullField[4] = { 0.0f };

	const tcu::Matrix<float, 2, 2> invA = inverse(Mat2(areaA));
	const tcu::Matrix<float, 2, 2> matB =         Mat2(areaB);
	const tcu::Matrix<float, 2, 2> matC =         Mat2(areaC);
	const tcu::Matrix<float, 2, 2> matD =         Mat2(areaD);

	const tcu::Matrix<float, 2, 2> schurComplement = inverse(matD - matC*invA*matB);
	const tcu::Matrix<float, 2, 2> zeroMat         = Mat2(nullField);

	const tcu::Matrix<float, 2, 2> blockA = invA + invA*matB*schurComplement*matC*invA;
	const tcu::Matrix<float, 2, 2> blockB = (zeroMat-invA)*matB*schurComplement;
	const tcu::Matrix<float, 2, 2> blockC = (zeroMat-schurComplement)*matC*invA;
	const tcu::Matrix<float, 2, 2> blockD = schurComplement;

	const float result[4*4] =
	{
		blockA(0,0),	blockA(0,1),	blockB(0,0),	blockB(0,1),
		blockA(1,0),	blockA(1,1),	blockB(1,0),	blockB(1,1),
		blockC(0,0),	blockC(0,1),	blockD(0,0),	blockD(0,1),
		blockC(1,0),	blockC(1,1),	blockD(1,0),	blockD(1,1),
	};

	return Mat4(result);
}